

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

void __thiscall
InstructionSet::x86::Decoder<(InstructionSet::x86::Model)1>::set_32bit_protected_mode
          (Decoder<(InstructionSet::x86::Model)1> *this,bool enabled)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    return;
  }
  __assert_fail("!enabled",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/InstructionSets/x86/Decoder.cpp"
                ,0x454,
                "void InstructionSet::x86::Decoder<InstructionSet::x86::Model::i80186>::set_32bit_protected_mode(bool) [model = InstructionSet::x86::Model::i80186]"
               );
}

Assistant:

void Decoder<model>::set_32bit_protected_mode(bool enabled) {
	if constexpr (!is_32bit(model)) {
		assert(!enabled);
		return;
	}

	if(enabled) {
		default_address_size_ = address_size_ = AddressSize::b32;
		default_data_size_ = data_size_ = DataSize::DWord;
	} else {
		default_address_size_ = address_size_ = AddressSize::b16;
		default_data_size_ = data_size_ = DataSize::Word;
	}
}